

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

void __thiscall
testing::internal::TypedExpectation<TestResult_(mp::LogicalConstant)>::~TypedExpectation
          (TypedExpectation<TestResult_(mp::LogicalConstant)> *this)

{
  linked_ptr<testing::ActionInterface<TestResult_(mp::LogicalConstant)>_> *this_00;
  pointer ppvVar1;
  
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_001e66a0;
  ExpectationBase::CheckActionCountIfNotDone(&this->super_ExpectationBase);
  for (ppvVar1 = (this->super_ExpectationBase).untyped_actions_.
                 super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppvVar1 !=
      (this->super_ExpectationBase).untyped_actions_.
      super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppvVar1 = ppvVar1 + 1) {
    this_00 = (linked_ptr<testing::ActionInterface<TestResult_(mp::LogicalConstant)>_> *)*ppvVar1;
    if (this_00 != (linked_ptr<testing::ActionInterface<TestResult_(mp::LogicalConstant)>_> *)0x0) {
      linked_ptr<testing::ActionInterface<TestResult_(mp::LogicalConstant)>_>::~linked_ptr(this_00);
      operator_delete(this_00,0x10);
    }
  }
  linked_ptr<testing::ActionInterface<TestResult_(mp::LogicalConstant)>_>::~linked_ptr
            (&(this->repeated_action_).impl_);
  (this->extra_matcher_).super_MatcherBase<const_std::tuple<mp::LogicalConstant>_&>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001e2f40;
  linked_ptr<const_testing::MatcherInterface<const_std::tuple<mp::LogicalConstant>_&>_>::~linked_ptr
            (&(this->extra_matcher_).super_MatcherBase<const_std::tuple<mp::LogicalConstant>_&>.
              impl_);
  (this->matchers_).super__Tuple_impl<0UL,_testing::Matcher<mp::LogicalConstant>_>.
  super__Head_base<0UL,_testing::Matcher<mp::LogicalConstant>,_false>._M_head_impl.
  super_MatcherBase<mp::LogicalConstant>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001e2f20;
  linked_ptr<const_testing::MatcherInterface<mp::LogicalConstant>_>::~linked_ptr
            (&(this->matchers_).super__Tuple_impl<0UL,_testing::Matcher<mp::LogicalConstant>_>.
              super__Head_base<0UL,_testing::Matcher<mp::LogicalConstant>,_false>._M_head_impl.
              super_MatcherBase<mp::LogicalConstant>.impl_);
  ExpectationBase::~ExpectationBase(&this->super_ExpectationBase);
  return;
}

Assistant:

virtual ~TypedExpectation() {
    // Check the validity of the action count if it hasn't been done
    // yet (for example, if the expectation was never used).
    CheckActionCountIfNotDone();
    for (UntypedActions::const_iterator it = untyped_actions_.begin();
         it != untyped_actions_.end(); ++it) {
      delete static_cast<const Action<F>*>(*it);
    }
  }